

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O0

void print_number(int64_t x)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  long in_RDI;
  char buffer [30];
  size_t ptr;
  int g;
  int rounding;
  int i;
  int c;
  int64_t y;
  int64_t x_abs;
  undefined8 local_60;
  undefined1 local_58 [28];
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  long local_30;
  uint local_28;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  if (in_RDI == -0x8000000000000000) {
    printf("ERR");
  }
  else {
    local_60 = in_RDI;
    if (in_RDI < 0) {
      local_60 = -in_RDI;
    }
    local_18 = local_60;
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if ((0 < local_18) && (bVar1 = false, local_18 < 100000000)) {
        bVar1 = local_1c < 6;
      }
      if (!bVar1) break;
      local_18 = local_18 * 10;
      local_1c = local_1c + 1;
    }
    local_18 = local_60;
    local_24 = 0;
    for (local_20 = local_1c; local_20 < 6; local_20 = local_20 + 1) {
      local_24 = (uint)(4 < local_18 % 10);
      local_18 = local_18 / 10;
    }
    local_18 = (int)local_24 + local_18;
    local_30 = 0x1d;
    if (local_1c == 0) {
      uStack_3c = 0x30;
      local_30 = 0x1c;
    }
    else {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        local_58[local_30 + -1] = (char)(local_18 % 10) + '0';
        local_18 = local_18 / 10;
        local_30 = local_30 + -1;
      }
    }
    uStack_3b = 0;
    local_10 = local_60;
    local_28 = 0;
    lVar2 = local_30 + -1;
    local_30 = local_30 + -1;
    local_8 = in_RDI;
    local_58[lVar2] = 0x2e;
    lVar2 = local_30;
    uVar3 = local_28;
    do {
      local_28 = uVar3;
      local_30 = lVar2;
      local_58[local_30 + -1] = (char)(local_18 % 10) + '0';
      local_18 = local_18 / 10;
      lVar2 = local_30 + -1;
      uVar3 = local_28 + 1;
    } while (local_18 != 0);
    if (local_8 < 0) {
      local_58[local_30 + -2] = 0x2d;
      lVar2 = local_30 + -2;
      uVar3 = local_28 + 2;
    }
    local_28 = uVar3;
    local_30 = lVar2;
    printf("%5.*s",(ulong)local_28,local_58 + local_30);
    printf("%-*s",6,local_58 + local_30 + (int)local_28);
  }
  return;
}

Assistant:

static void print_number(const int64_t x) {
    int64_t x_abs, y;
    int c, i, rounding, g; /* g = integer part size, c = fractional part size */
    size_t ptr;
    char buffer[30];

    if (x == INT64_MIN) {
        /* Prevent UB. */
        printf("ERR");
        return;
    }
    x_abs = x < 0 ? -x : x;

    /* Determine how many decimals we want to show (more than FP_EXP makes no
     * sense). */
    y = x_abs;
    c = 0;
    while (y > 0LL && y < 100LL * FP_MULT && c < FP_EXP) {
        y *= 10LL;
        c++;
    }

    /* Round to 'c' decimals. */
    y = x_abs;
    rounding = 0;
    for (i = c; i < FP_EXP; ++i) {
        rounding = (y % 10) >= 5;
        y /= 10;
    }
    y += rounding;

    /* Format and print the number. */
    ptr = sizeof(buffer) - 1;
    buffer[ptr] = 0;
    g = 0;
    if (c != 0) { /* non zero fractional part */
        for (i = 0; i < c; ++i) {
            buffer[--ptr] = '0' + (y % 10);
            y /= 10;
        }
    } else if (c == 0) { /* fractional part is 0 */
        buffer[--ptr] = '0'; 
    }
    buffer[--ptr] = '.';
    do {
        buffer[--ptr] = '0' + (y % 10);
        y /= 10;
        g++;
    } while (y != 0);
    if (x < 0) {
        buffer[--ptr] = '-';
        g++;
    }
    printf("%5.*s", g, &buffer[ptr]); /* Prints integer part */
    printf("%-*s", FP_EXP, &buffer[ptr + g]); /* Prints fractional part */
}